

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VincentyDestination.cpp
# Opt level: O2

LLPoint GeoCalcs::DestVincenty(LLPoint *pt,double brng,double dist)

{
  uint uVar1;
  double dVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double __x_00;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double __x_01;
  LLPoint LVar12;
  double local_78;
  double local_58;
  
  dVar2 = sin(brng);
  __x = cos(brng);
  dVar3 = tan(pt->latitude);
  dVar3 = dVar3 * 0.99664718933526;
  dVar10 = 1.0 / SQRT(dVar3 * dVar3 + 1.0);
  dVar4 = atan2(dVar3,__x);
  dVar5 = dVar2 * dVar10;
  dVar8 = 1.0 - dVar5 * dVar5;
  dVar6 = (dVar8 * 272331606106.95312) / 40408299984662.05;
  dVar11 = (((dVar6 * -47.0 + 74.0) * dVar6 + -128.0) * dVar6 + 256.0) * dVar6 * 0.0009765625;
  __x_00 = dist / (((((dVar6 * -175.0 + 320.0) * dVar6 + -768.0) * dVar6 + 4096.0) *
                    dVar6 * 6.103515625e-05 + 1.0) * 6356752.314245227);
  local_78 = sin(__x_00);
  dVar7 = cos(__x_00);
  local_58 = cos(dVar4 + dVar4 + __x_00);
  dVar6 = 6.283185307179586;
  __x_01 = __x_00;
  for (uVar1 = 0; (5e-16 < ABS(__x_01 - dVar6) && (uVar1 < 99)); uVar1 = uVar1 + 1) {
    local_58 = cos(dVar4 + dVar4 + __x_01);
    local_78 = sin(__x_01);
    dVar7 = cos(__x_01);
    dVar9 = local_58 * local_58;
    dVar6 = __x_01;
    __x_01 = (((dVar9 + dVar9 + -1.0) * dVar7 +
              (dVar11 / -6.0) * local_58 * (local_78 * 4.0 * local_78 + -3.0) * (dVar9 * 4.0 + -3.0)
              ) * dVar11 * 0.25 + local_58) * dVar11 * local_78 + __x_00;
  }
  dVar6 = dVar3 * dVar10 * local_78;
  dVar4 = dVar6 - __x * dVar10 * dVar7;
  LVar12.latitude =
       atan2(dVar3 * dVar10 * dVar7 + dVar10 * local_78 * __x,
             SQRT(dVar5 * dVar5 + dVar4 * dVar4) * 0.99664718933526);
  dVar6 = atan2(dVar2 * local_78,dVar10 * dVar7 - dVar6 * __x);
  dVar2 = ((dVar8 * -3.0 + 4.0) * 0.0033528106647399995 + 4.0) * dVar8 * 0.00020955066654624997;
  LVar12.longitude =
       dVar5 * (1.0 - dVar2) * -0.0033528106647399995 *
       ((((local_58 + local_58) * local_58 + -1.0) * dVar2 * dVar7 + local_58) * local_78 * dVar2 +
       __x_01) + dVar6 + pt->longitude;
  return LVar12;
}

Assistant:

LLPoint DestVincenty(const LLPoint &pt, double brng, double dist)
    {
        double s = dist;
        double alpha1 = brng;
        double sinAlpha1 = sin(alpha1);
        double cosAlpha1 = cos(alpha1);

        double tanU1 = (1.0 - kFlattening) * tan(pt.latitude);
        double cosU1 = 1.0 / sqrt((1.0 + tanU1 * tanU1));
        double sinU1 = tanU1 * cosU1;
        double sigma1 = atan2(tanU1, cosAlpha1);
        double sinAlpha = cosU1 * sinAlpha1;
        double cosSqAlpha = 1.0 - sinAlpha * sinAlpha;
        double uSq = cosSqAlpha * (kSemiMajorAxis * kSemiMajorAxis - kSemiMinorAxis * kSemiMinorAxis) /
                     (kSemiMinorAxis * kSemiMinorAxis);
        double A = 1.0 + uSq / 16384.0 * (4096.0 + uSq * (-768.0 + uSq * (320.0 - 175.0 * uSq)));
        double B = uSq / 1024.0 * (256.0 + uSq * (-128.0 + uSq * (74.0 - 47.0 * uSq)));

        double sigma = s / (kSemiMinorAxis * A);
        double sigmaP = M_2PI;
        double sinSigma = sin(sigma);
        double cosSigma = cos(sigma);
        double cos2SigmaM = cos(2.0 * sigma1 + sigma);
        int iterLimit = 0;
        while (fabs(sigma - sigmaP) > kEps && ++iterLimit < 100)
        {
            cos2SigmaM = cos(2.0 * sigma1 + sigma);
            sinSigma = sin(sigma);
            cosSigma = cos(sigma);
            double cos2SigmaSq = cos2SigmaM * cos2SigmaM;
            double deltaSigma = B * sinSigma * (cos2SigmaM + B * 0.25 * (cosSigma * (-1.0 + 2.0 * cos2SigmaSq) -
                                                                         B / 6.0 * cos2SigmaM *
                                                                         (-3.0 + 4.0 * sinSigma * sinSigma) *
                                                                         (-3.0 + 4.0 * cos2SigmaSq)));

            sigmaP = sigma;
            sigma = s / (kSemiMinorAxis * A) + deltaSigma;
        }

        double tmp = sinU1 * sinSigma - cosU1 * cosSigma * cosAlpha1;
        double lat2 = atan2(sinU1 * cosSigma + cosU1 * sinSigma * cosAlpha1,
                            (1.0 - kFlattening) * sqrt(sinAlpha * sinAlpha + tmp * tmp));
        double lambda = atan2(sinSigma * sinAlpha1, cosU1 * cosSigma - sinU1 * sinSigma * cosAlpha1);
        double C = kFlattening / 16.0 * cosSqAlpha * (4.0 + kFlattening * (4.0 - 3.0 * cosSqAlpha));
        double L = lambda - (1.0 - C) * kFlattening * sinAlpha *
                            (sigma +
                             C * sinSigma * (cos2SigmaM + C * cosSigma * (-1.0 + 2.0 * cos2SigmaM * cos2SigmaM)));

        return LLPoint(lat2, pt.longitude + L);
    }